

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams_from_file.hpp
# Opt level: O2

void __thiscall
iutest::detail::iuCsvFileParamsGenerator<int>::iuCsvFileParamsGenerator
          (iuCsvFileParamsGenerator<int> *this,string *path,char delimiter)

{
  _Vector_base<int,_std::allocator<int>_> local_30;
  
  (this->super_iuValuesInParamsGenerator<int>).super_iuIParamGenerator<int>._vptr_iuIParamGenerator
       = (_func_int **)&PTR__iuValuesInParamsGenerator_00240200;
  ReadParams((params_t *)&local_30,this,path,delimiter);
  iuValuesInParamsGenerator<int>::iuValuesInParamsGenerator
            (&this->super_iuValuesInParamsGenerator<int>,(params_t *)&local_30);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_30);
  (this->super_iuValuesInParamsGenerator<int>).super_iuIParamGenerator<int>._vptr_iuIParamGenerator
       = (_func_int **)&PTR__iuValuesInParamsGenerator_00240200;
  return;
}

Assistant:

explicit iuCsvFileParamsGenerator(const ::std::string& path, char delimiter = ',')
        : iuValuesInParamsGenerator<T>(ReadParams(path, delimiter))
    {
    }